

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolve.cpp
# Opt level: O0

void assessExcessiveBoundCost(HighsLogOptions *log_options,HighsModel *model)

{
  HighsInt HVar1;
  int *in_RSI;
  HighsSparseMatrix *in_RDI;
  HighsInt suggested_bound_scale_exponent_3;
  HighsInt suggested_user_bound_scale_3;
  double ratio_5;
  double user_bound_scale_value_3;
  HighsInt suggested_bound_scale_exponent_2;
  HighsInt suggested_user_bound_scale_2;
  double ratio_4;
  double user_bound_scale_value_2;
  HighsInt suggested_cost_scale_exponent_1;
  HighsInt suggested_user_cost_scale_setting_1;
  double ratio_3;
  double user_cost_scale_value_1;
  HighsInt suggested_bound_scale_exponent_1;
  HighsInt suggested_user_bound_scale_1;
  double ratio_2;
  double user_bound_scale_value_1;
  HighsInt suggested_bound_scale_exponent;
  HighsInt suggested_user_bound_scale;
  double ratio_1;
  double user_bound_scale_value;
  HighsInt suggested_cost_scale_exponent;
  HighsInt suggested_user_cost_scale_setting;
  double ratio;
  double user_cost_scale_value;
  HighsInt iEl;
  HighsInt num_nz;
  HighsInt iRow;
  HighsInt iCol;
  double max_matrix_value;
  double min_matrix_value;
  double max_finite_row_bound;
  double min_finite_row_bound;
  double max_finite_col_bound;
  double min_finite_col_bound;
  double max_finite_col_cost;
  double min_finite_col_cost;
  HighsLp *lp;
  anon_class_1_0_00000001 assessFiniteNonzero;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  double in_stack_ffffffffffffff08;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff10;
  int local_70;
  int local_68;
  int local_64;
  
  for (local_64 = 0; local_64 < *in_RSI; local_64 = local_64 + 1) {
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RSI + 2),(long)local_64);
    assessExcessiveBoundCost::anon_class_1_0_00000001::operator()
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               (double *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (double *)in_RDI);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RSI + 8),(long)local_64);
    assessExcessiveBoundCost::anon_class_1_0_00000001::operator()
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               (double *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (double *)in_RDI);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RSI + 0xe),(long)local_64);
    assessExcessiveBoundCost::anon_class_1_0_00000001::operator()
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               (double *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (double *)in_RDI);
  }
  for (local_68 = 0; local_68 < in_RSI[1]; local_68 = local_68 + 1) {
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x14),(long)local_68);
    assessExcessiveBoundCost::anon_class_1_0_00000001::operator()
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               (double *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (double *)in_RDI);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x1a),(long)local_68);
    assessExcessiveBoundCost::anon_class_1_0_00000001::operator()
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               (double *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (double *)in_RDI);
  }
  HVar1 = HighsSparseMatrix::numNz(in_RDI);
  for (local_70 = 0; local_70 < HVar1; local_70 = local_70 + 1) {
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x36),(long)local_70);
    assessExcessiveBoundCost::anon_class_1_0_00000001::operator()
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               (double *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (double *)in_RDI);
  }
  highsLogUser((HighsLogOptions *)in_RDI,kInfo,"Coefficient ranges:\n");
  if (HVar1 != 0) {
    highsLogUser((HighsLogOptions *)0x7ff0000000000000,0xfff0000000000000,(char *)in_RDI,1,
                 "  Matrix [%5.0e, %5.0e]\n");
  }
  if (*in_RSI != 0) {
    highsLogUser((HighsLogOptions *)0x0,0,(char *)in_RDI,1,"  Cost   [%5.0e, %5.0e]\n");
    highsLogUser((HighsLogOptions *)0x0,0,(char *)in_RDI,1,"  Bound  [%5.0e, %5.0e]\n");
  }
  if (in_RSI[1] != 0) {
    highsLogUser((HighsLogOptions *)0x0,0,(char *)in_RDI,1,"  RHS    [%5.0e, %5.0e]\n");
  }
  return;
}

Assistant:

void assessExcessiveBoundCost(const HighsLogOptions log_options,
                              const HighsModel& model) {
  auto assessFiniteNonzero = [&](const double value, double& min_value,
                                 double& max_value) {
    double abs_value = std::abs(value);
    if (abs_value > 0 && abs_value < kHighsInf) {
      min_value = std::min(abs_value, min_value);
      max_value = std::max(abs_value, max_value);
    }
  };
  const HighsLp& lp = model.lp_;
  double min_finite_col_cost = kHighsInf;
  double max_finite_col_cost = -kHighsInf;
  double min_finite_col_bound = kHighsInf;
  double max_finite_col_bound = -kHighsInf;
  double min_finite_row_bound = kHighsInf;
  double max_finite_row_bound = -kHighsInf;
  double min_matrix_value = kHighsInf;
  double max_matrix_value = -kHighsInf;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    assessFiniteNonzero(lp.col_cost_[iCol], min_finite_col_cost,
                        max_finite_col_cost);
    assessFiniteNonzero(lp.col_lower_[iCol], min_finite_col_bound,
                        max_finite_col_bound);
    assessFiniteNonzero(lp.col_upper_[iCol], min_finite_col_bound,
                        max_finite_col_bound);
  }
  if (min_finite_col_cost == kHighsInf) min_finite_col_cost = 0;
  if (max_finite_col_cost == -kHighsInf) max_finite_col_cost = 0;
  if (min_finite_col_bound == kHighsInf) min_finite_col_bound = 0;
  if (max_finite_col_bound == -kHighsInf) max_finite_col_bound = 0;
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    assessFiniteNonzero(lp.row_lower_[iRow], min_finite_row_bound,
                        max_finite_row_bound);
    assessFiniteNonzero(lp.row_upper_[iRow], min_finite_row_bound,
                        max_finite_row_bound);
  }
  if (min_finite_row_bound == kHighsInf) min_finite_row_bound = 0;
  if (max_finite_row_bound == -kHighsInf) max_finite_row_bound = 0;
  HighsInt num_nz = lp.a_matrix_.numNz();
  for (HighsInt iEl = 0; iEl < num_nz; iEl++)
    assessFiniteNonzero(lp.a_matrix_.value_[iEl], min_matrix_value,
                        max_matrix_value);

  highsLogUser(log_options, HighsLogType::kInfo, "Coefficient ranges:\n");
  if (num_nz)
    highsLogUser(log_options, HighsLogType::kInfo, "  Matrix [%5.0e, %5.0e]\n",
                 min_matrix_value, max_matrix_value);
  if (lp.num_col_) {
    highsLogUser(log_options, HighsLogType::kInfo, "  Cost   [%5.0e, %5.0e]\n",
                 min_finite_col_cost, max_finite_col_cost);
    highsLogUser(log_options, HighsLogType::kInfo, "  Bound  [%5.0e, %5.0e]\n",
                 min_finite_col_bound, max_finite_col_bound);
  }
  if (lp.num_row_)
    highsLogUser(log_options, HighsLogType::kInfo, "  RHS    [%5.0e, %5.0e]\n",
                 min_finite_row_bound, max_finite_row_bound);

  // LPs with no columns or no finite nonzero costs will have
  // max_finite_col_cost = 0
  assert(max_finite_col_cost >= 0);
  if (max_finite_col_cost > kExcessivelyLargeCostValue) {
    double user_cost_scale_value = std::pow(2, lp.user_cost_scale_);
    // Warn that costs are excessively large, and suggest scaling
    double ratio = kExcessivelyLargeCostValue /
                   (max_finite_col_cost / user_cost_scale_value);
    HighsInt suggested_user_cost_scale_setting = std::floor(std::log2(ratio));
    HighsInt suggested_cost_scale_exponent = std::floor(std::log10(ratio));
    highsLogUser(
        log_options, HighsLogType::kWarning,
        "%s has excessively large costs: consider scaling the costs "
        "by 1e%+1d or less, or setting option user_cost_scale to %d or less\n",
        lp.user_cost_scale_ ? "User-scaled problem" : "Problem",
        int(-suggested_cost_scale_exponent),
        int(suggested_user_cost_scale_setting));
  }
  // LPs with no columns or no finite nonzero bounds will have
  // max_finite_col_bound = 0
  assert(max_finite_col_bound >= 0);
  if (max_finite_col_bound > kExcessivelyLargeBoundValue) {
    double user_bound_scale_value = std::pow(2, lp.user_bound_scale_);
    // Warn that bounds are excessively large, and suggest scaling
    double ratio = kExcessivelyLargeBoundValue /
                   (max_finite_col_bound / user_bound_scale_value);
    HighsInt suggested_user_bound_scale = std::floor(std::log2(ratio));
    HighsInt suggested_bound_scale_exponent = std::floor(std::log10(ratio));
    if (lp.isMip()) {
      highsLogUser(
          log_options, HighsLogType::kWarning,
          "%s has excessively large bounds: consider scaling the bounds "
          "by 1e%+1d or less\n",
          lp.user_bound_scale_ ? "User-scaled problem" : "Problem",
          int(-suggested_bound_scale_exponent));
    } else {
      highsLogUser(
          log_options, HighsLogType::kWarning,
          "%s has excessively large bounds: consider scaling the bounds "
          "by 1e%+1d or less, "
          "or setting option user_bound_scale to %d or less\n",
          lp.user_bound_scale_ ? "User-scaled problem" : "Problem",
          int(-suggested_bound_scale_exponent),
          int(suggested_user_bound_scale));
    }
  }
  // LPs with no rows or no finite nonzero bounds will have
  // max_finite_row_bound = 0
  assert(max_finite_row_bound >= 0);
  if (max_finite_row_bound > kExcessivelyLargeBoundValue) {
    double user_bound_scale_value = std::pow(2, lp.user_bound_scale_);
    // Warn that bounds are excessively large, and suggest scaling
    double ratio = kExcessivelyLargeBoundValue /
                   (max_finite_row_bound / user_bound_scale_value);
    HighsInt suggested_user_bound_scale = std::floor(std::log2(ratio));
    HighsInt suggested_bound_scale_exponent = std::floor(std::log10(ratio));
    if (lp.isMip()) {
      highsLogUser(
          log_options, HighsLogType::kWarning,
          "%s has excessively large bounds: consider scaling the bounds "
          "by 1e%+1d or less\n",
          lp.user_bound_scale_ ? "User-scaled problem" : "Problem",
          int(-suggested_bound_scale_exponent));
    } else {
      highsLogUser(
          log_options, HighsLogType::kWarning,
          "%s has excessively large bounds: consider scaling the bounds "
          "by 1e%+1d or less, "
          "or setting option user_bound_scale to %d or less\n",
          lp.user_bound_scale_ ? "User-scaled problem" : "Problem",
          int(-suggested_bound_scale_exponent),
          int(suggested_user_bound_scale));
    }
  }
  // Now consider warning relating to small maximum costs and bounds
  if (max_finite_col_cost > 0 &&
      max_finite_col_cost < kExcessivelySmallCostValue) {
    double user_cost_scale_value = std::pow(2, lp.user_cost_scale_);
    // Warn that costs are excessively small, and suggest scaling
    double ratio = kExcessivelySmallCostValue /
                   (max_finite_col_cost / user_cost_scale_value);
    HighsInt suggested_user_cost_scale_setting = std::ceil(std::log2(ratio));
    HighsInt suggested_cost_scale_exponent = std::ceil(std::log10(ratio));
    highsLogUser(
        log_options, HighsLogType::kWarning,
        "%s has excessively small costs: consider scaling the costs up "
        "by 1e%+1d or more, "
        "or setting option user_cost_scale to %d or more\n",
        lp.user_cost_scale_ ? "User-scaled problem" : "Problem",
        int(suggested_cost_scale_exponent),
        int(suggested_user_cost_scale_setting));
  }
  if (max_finite_col_bound > 0 &&
      max_finite_col_bound < kExcessivelySmallBoundValue) {
    double user_bound_scale_value = std::pow(2, lp.user_bound_scale_);
    // Warn that bounds are excessively small, and suggest scaling
    double ratio = kExcessivelySmallBoundValue /
                   (max_finite_col_bound / user_bound_scale_value);
    HighsInt suggested_user_bound_scale = std::ceil(std::log2(ratio));
    HighsInt suggested_bound_scale_exponent = std::ceil(std::log10(ratio));
    if (lp.isMip()) {
      highsLogUser(
          log_options, HighsLogType::kWarning,
          "%s has excessively small bounds: consider scaling the bounds "
          "by 1e%+1d or more\n",
          lp.user_bound_scale_ ? "User-scaled problem" : "Problem",
          int(suggested_bound_scale_exponent));
    } else {
      highsLogUser(
          log_options, HighsLogType::kWarning,
          "%s has excessively small bounds: consider scaling the bounds "
          "by 1e%+1d or more, "
          "or setting option user_bound_scale to %d or more\n",
          lp.user_bound_scale_ ? "User-scaled problem" : "Problem",
          int(suggested_bound_scale_exponent), int(suggested_user_bound_scale));
    }
  }
  if (max_finite_row_bound > 0 &&
      max_finite_row_bound < kExcessivelySmallBoundValue) {
    double user_bound_scale_value = std::pow(2, lp.user_bound_scale_);
    // Warn that bounds are excessively small, and suggest scaling
    double ratio = kExcessivelySmallBoundValue /
                   (max_finite_row_bound / user_bound_scale_value);
    HighsInt suggested_user_bound_scale = std::ceil(std::log2(ratio));
    HighsInt suggested_bound_scale_exponent = std::ceil(std::log10(ratio));
    if (lp.isMip()) {
      highsLogUser(
          log_options, HighsLogType::kWarning,
          "%s has excessively small bounds: consider scaling the bounds "
          "by 1e%+1d or more\n",
          lp.user_bound_scale_ ? "User-scaled problem" : "Problem",
          int(suggested_bound_scale_exponent));
    } else {
      highsLogUser(
          log_options, HighsLogType::kWarning,
          "%s has excessively small bounds: consider scaling the bounds "
          "by 1e%+1d or more, "
          "or setting option user_bound_scale to %d or more\n",
          lp.user_bound_scale_ ? "User-scaled problem" : "Problem",
          int(suggested_bound_scale_exponent), int(suggested_user_bound_scale));
    }
  }
}